

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmRestrictions.cpp
# Opt level: O0

void __thiscall
GmmLib::GmmTextureCalc::GetGenericRestrictions
          (GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,__GMM_BUFFER_TYPE *pBuff)

{
  undefined2 uVar1;
  undefined4 uVar2;
  uint8_t uVar3;
  int iVar4;
  GMM_PLATFORM_INFO *pGVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  GMM_PLATFORM_INFO *pPlatformResource;
  __GMM_BUFFER_TYPE *pBuff_local;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmTextureCalc *this_local;
  
  pGVar5 = GmmGetPlatformInfo(this->pGmmLibContext);
  if (((ulong)(pTexInfo->Flags).Gpu >> 0x12 & 1) == 0) {
    if (((ulong)(pTexInfo->Flags).Gpu >> 0x22 & 1) != 0) {
      if (pTexInfo->Type == RESOURCE_BUFFER) {
        memcpy(pBuff,&pGVar5->BufferType,0x60);
      }
      else if (pTexInfo->Type == RESOURCE_CUBE) {
        memcpy(pBuff,&pGVar5->CubeSurface,0x60);
      }
      else if (pTexInfo->Type == RESOURCE_3D) {
        memcpy(pBuff,&pGVar5->Texture3DSurface,0x60);
      }
      else {
        memcpy(pBuff,&pGVar5->Texture2DSurface,0x60);
        if (((ulong)(pTexInfo->Flags).Info >> 0x13 & 1) != 0) {
          memcpy(pBuff,&pGVar5->Texture2DLinearSurface,0x60);
        }
        uVar3 = GmmIsReconstructableSurface(pTexInfo->Format);
        if (uVar3 != '\0') {
          pBuff->MaxHeight = pGVar5->ReconMaxHeight;
          pBuff->MaxWidth = pGVar5->ReconMaxWidth;
        }
      }
    }
    if (((((ulong)(pTexInfo->Flags).Gpu >> 0x17 & 1) != 0) ||
        (((ulong)(pTexInfo->Flags).Gpu >> 1 & 1) != 0)) ||
       (((ulong)(pTexInfo->Flags).Gpu >> 0xf & 1) != 0)) {
      if (pTexInfo->Type == RESOURCE_BUFFER) {
        memcpy(pBuff,&pGVar5->BufferType,0x60);
      }
      else if (pTexInfo->Type == RESOURCE_CUBE) {
        memcpy(pBuff,&pGVar5->CubeSurface,0x60);
      }
      else if (pTexInfo->Type == RESOURCE_3D) {
        memcpy(pBuff,&pGVar5->Texture3DSurface,0x60);
      }
      else {
        memcpy(pBuff,&pGVar5->Texture2DSurface,0x60);
        if (((ulong)(pTexInfo->Flags).Info >> 0x13 & 1) != 0) {
          memcpy(pBuff,&pGVar5->Texture2DLinearSurface,0x60);
        }
        uVar3 = GmmIsReconstructableSurface(pTexInfo->Format);
        if (uVar3 != '\0') {
          pBuff->MaxHeight = pGVar5->ReconMaxHeight;
          pBuff->MaxWidth = pGVar5->ReconMaxWidth;
        }
      }
    }
    pPlatformResource = (GMM_PLATFORM_INFO *)pBuff;
    if (((ulong)(pTexInfo->Flags).Gpu >> 6 & 1) != 0) {
      iVar4 = (*this->_vptr_GmmTextureCalc[2])(this,pBuff,&pGVar5->Depth);
      pPlatformResource = (GMM_PLATFORM_INFO *)CONCAT44(extraout_var,iVar4);
    }
    if (((ulong)(pTexInfo->Flags).Gpu >> 0x26 & 1) != 0) {
      iVar4 = (*this->_vptr_GmmTextureCalc[2])(this,pPlatformResource,&pGVar5->Vertex);
      pPlatformResource = (GMM_PLATFORM_INFO *)CONCAT44(extraout_var_00,iVar4);
    }
    if (((ulong)(pTexInfo->Flags).Gpu >> 0xb & 1) != 0) {
      iVar4 = (*this->_vptr_GmmTextureCalc[2])(this,pPlatformResource,&pGVar5->Index);
      pPlatformResource = (GMM_PLATFORM_INFO *)CONCAT44(extraout_var_01,iVar4);
    }
    if (((ulong)(pTexInfo->Flags).Gpu >> 7 & 1) != 0) {
      iVar4 = (*this->_vptr_GmmTextureCalc[2])(this,pPlatformResource,&pGVar5->ASyncFlipSurface);
      pPlatformResource = (GMM_PLATFORM_INFO *)CONCAT44(extraout_var_02,iVar4);
    }
    if (((ulong)(pTexInfo->Flags).Gpu >> 0x11 & 1) != 0) {
      iVar4 = (*this->_vptr_GmmTextureCalc[2])(this,pPlatformResource,&pGVar5->MotionComp);
      pPlatformResource = (GMM_PLATFORM_INFO *)CONCAT44(extraout_var_03,iVar4);
    }
    if (((((ulong)(pTexInfo->Flags).Gpu >> 0x1e & 1) != 0) ||
        (((ulong)(pTexInfo->Flags).Gpu >> 0xd & 1) != 0)) ||
       (((ulong)(pTexInfo->Flags).Gpu >> 0x1c & 1) != 0)) {
      iVar4 = (*this->_vptr_GmmTextureCalc[2])(this,pPlatformResource,&pGVar5->Vertex);
      pPlatformResource = (GMM_PLATFORM_INFO *)CONCAT44(extraout_var_04,iVar4);
    }
    if ((((ulong)(pTexInfo->Flags).Gpu >> 0x16 & 1) != 0) ||
       (((ulong)(pTexInfo->Flags).Gpu >> 9 & 1) != 0)) {
      iVar4 = (*this->_vptr_GmmTextureCalc[2])(this,pPlatformResource,&pGVar5->NoRestriction);
      pPlatformResource = (GMM_PLATFORM_INFO *)CONCAT44(extraout_var_05,iVar4);
    }
    if (((ulong)(pTexInfo->Flags).Gpu >> 5 & 1) != 0) {
      iVar4 = (*this->_vptr_GmmTextureCalc[2])(this,pPlatformResource,&pGVar5->Constant);
      pPlatformResource = (GMM_PLATFORM_INFO *)CONCAT44(extraout_var_06,iVar4);
    }
    if (((ulong)(pTexInfo->Flags).Gpu >> 0x20 & 1) != 0) {
      iVar4 = (*this->_vptr_GmmTextureCalc[2])(this,pPlatformResource,&pGVar5->Stream);
      pPlatformResource = (GMM_PLATFORM_INFO *)CONCAT44(extraout_var_07,iVar4);
    }
    if (((ulong)(pTexInfo->Flags).Gpu >> 0xe & 1) != 0) {
      iVar4 = (*this->_vptr_GmmTextureCalc[2])(this,pPlatformResource,&pGVar5->InterlacedScan);
      pPlatformResource = (GMM_PLATFORM_INFO *)CONCAT44(extraout_var_08,iVar4);
    }
    if (((ulong)(pTexInfo->Flags).Gpu >> 0x21 & 1) != 0) {
      iVar4 = (*this->_vptr_GmmTextureCalc[2])(this,pPlatformResource,&pGVar5->TextApi);
      pPlatformResource = (GMM_PLATFORM_INFO *)CONCAT44(extraout_var_09,iVar4);
    }
    if (((ulong)(pTexInfo->Flags).Gpu >> 0x1d & 1) != 0) {
      iVar4 = (*this->_vptr_GmmTextureCalc[2])(this,pPlatformResource,&pGVar5->Stencil);
      pPlatformResource = (GMM_PLATFORM_INFO *)CONCAT44(extraout_var_10,iVar4);
    }
    if (((ulong)(pTexInfo->Flags).Gpu >> 10 & 1) != 0) {
      iVar4 = (*this->_vptr_GmmTextureCalc[2])(this,pPlatformResource,&pGVar5->HiZ);
      pPlatformResource = (GMM_PLATFORM_INFO *)CONCAT44(extraout_var_11,iVar4);
    }
    if (((ulong)(pTexInfo->Flags).Gpu >> 0x27 & 1) != 0) {
      iVar4 = (*this->_vptr_GmmTextureCalc[2])(this,pPlatformResource,&pGVar5->Video);
      pPlatformResource = (GMM_PLATFORM_INFO *)CONCAT44(extraout_var_12,iVar4);
      uVar3 = GmmIsReconstructableSurface(pTexInfo->Format);
      if (uVar3 != '\0') {
        (pPlatformResource->Vertex).MinAllocationSize = pGVar5->ReconMaxHeight;
        *(uint64_t *)&(pPlatformResource->Vertex).MinHeight = pGVar5->ReconMaxWidth;
      }
    }
    if (((ulong)(pTexInfo->Flags).Gpu >> 0x1f & 1) != 0) {
      iVar4 = (*this->_vptr_GmmTextureCalc[2])
                        (this,pPlatformResource,&pGVar5->StateDx9ConstantBuffer);
      pPlatformResource = (GMM_PLATFORM_INFO *)CONCAT44(extraout_var_13,iVar4);
    }
    if (((ulong)(pTexInfo->Flags).Gpu >> 0x13 & 1) != 0) {
      iVar4 = (*this->_vptr_GmmTextureCalc[2])(this,pPlatformResource,&pGVar5->Overlay);
      pPlatformResource = (GMM_PLATFORM_INFO *)CONCAT44(extraout_var_14,iVar4);
      if ((pTexInfo->Format == GMM_FORMAT_YCRCB_NORMAL) && (pTexInfo->BaseWidth == 0x280)) {
        (pPlatformResource->Platform).ePCHProductFamily = 0x40;
      }
    }
    if (((ulong)(pTexInfo->Flags).Info >> 0x28 & 1) != 0) {
      iVar4 = (*this->_vptr_GmmTextureCalc[2])(this,pPlatformResource,&pGVar5->XAdapter);
      pPlatformResource = (GMM_PLATFORM_INFO *)CONCAT44(extraout_var_15,iVar4);
      if (pTexInfo->Type == RESOURCE_BUFFER) {
        *(int64_t *)&(pPlatformResource->Vertex).MinHeight = pGVar5->SurfaceMaxSize;
        uVar1 = *(undefined2 *)((long)&(pGVar5->BufferType).MaxPitch + 2);
        uVar2 = *(undefined4 *)((long)&(pGVar5->BufferType).MaxPitch + 4);
        (pPlatformResource->Platform).usDeviceID_PCH = *(undefined2 *)&(pGVar5->BufferType).MaxPitch
        ;
        (pPlatformResource->Platform).usRevId_PCH = uVar1;
        (pPlatformResource->Platform).eGTType = uVar2;
        (pPlatformResource->Vertex).MinAllocationSize = 1;
      }
    }
    if (((((((ulong)(pTexInfo->Flags).Info >> 5 & 1) != 0) &&
          ((pTexInfo->ExistingSysMem).IsGmmAllocated == '\0')) &&
         ((pTexInfo->ExistingSysMem).IsPageAligned == '\0')) &&
        ((((ulong)(pTexInfo->Flags).Info >> 0x13 & 1) != 0 ||
         (((ulong)(pTexInfo->Flags).Info >> 0x21 & 1) != 0)))) &&
       (pTexInfo->Type == RESOURCE_BUFFER)) {
      memcpy(pPlatformResource,&pGVar5->BufferType,0x60);
      (pPlatformResource->Platform).ePCHProductFamily = (pGVar5->NoRestriction).PitchAlignment;
      (pPlatformResource->Platform).eRenderCoreFamily = (pGVar5->NoRestriction).LockPitchAlignment;
      (pPlatformResource->Platform).eDisplayCoreFamily = (pGVar5->NoRestriction).LockPitchAlignment;
      (pPlatformResource->Platform).ePlatformType = (pGVar5->NoRestriction).MinPitch;
    }
  }
  else {
    (*this->_vptr_GmmTextureCalc[2])(this,pBuff,&pGVar5->NoRestriction);
  }
  return;
}

Assistant:

void GmmLib::GmmTextureCalc::GetGenericRestrictions(GMM_TEXTURE_INFO *pTexInfo, __GMM_BUFFER_TYPE *pBuff)
{
    GMM_DPF_ENTER;
    const GMM_PLATFORM_INFO *pPlatformResource = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    if(pTexInfo->Flags.Gpu.NoRestriction)
    {
        // Impose zero restrictions. Ignore any other GPU usage flags
        pBuff = GetBestRestrictions(pBuff, &pPlatformResource->NoRestriction);
        return;
    }

    if(pTexInfo->Flags.Gpu.Texture)
    {
        if(pTexInfo->Type == RESOURCE_BUFFER)
        {
            *pBuff = pPlatformResource->BufferType;
        }
        else if(pTexInfo->Type == RESOURCE_CUBE)
        {
            *pBuff = pPlatformResource->CubeSurface;
        }
        else if(pTexInfo->Type == RESOURCE_3D)
        {
            *pBuff = pPlatformResource->Texture3DSurface;
        }
        else
        {
            *pBuff = pPlatformResource->Texture2DSurface;
            if(pTexInfo->Flags.Info.Linear)
            {
                *pBuff = pPlatformResource->Texture2DLinearSurface;
            }
            if(GmmIsReconstructableSurface(pTexInfo->Format))
            {
                pBuff->MaxHeight = pPlatformResource->ReconMaxHeight;
                pBuff->MaxWidth  = pPlatformResource->ReconMaxWidth;
            }
        }
    }
    if(pTexInfo->Flags.Gpu.RenderTarget ||
       pTexInfo->Flags.Gpu.CCS ||
       pTexInfo->Flags.Gpu.MCS)
    {
        // Gen7 onwards, bound by SURFACE_STATE constraints.
        if(pTexInfo->Type == RESOURCE_BUFFER)
        {
            *pBuff = pPlatformResource->BufferType;
        }
        else if(pTexInfo->Type == RESOURCE_CUBE)
        {
            *pBuff = pPlatformResource->CubeSurface;
        }
        else if(pTexInfo->Type == RESOURCE_3D)
        {
            *pBuff = pPlatformResource->Texture3DSurface;
        }
        else
        {
            *pBuff = pPlatformResource->Texture2DSurface;
            if(pTexInfo->Flags.Info.Linear)
            {
                *pBuff = pPlatformResource->Texture2DLinearSurface;
            }
            if(GmmIsReconstructableSurface(pTexInfo->Format))
            {
                pBuff->MaxHeight = pPlatformResource->ReconMaxHeight;
                pBuff->MaxWidth  = pPlatformResource->ReconMaxWidth;
            }
        }
    }
    if(pTexInfo->Flags.Gpu.Depth)
    {
        // Z
        pBuff = GetBestRestrictions(pBuff, &pPlatformResource->Depth);
    }
    if(pTexInfo->Flags.Gpu.Vertex)
    {
        // VertexData
        pBuff = GetBestRestrictions(pBuff, &pPlatformResource->Vertex);
    }
    if(pTexInfo->Flags.Gpu.Index)
    {
        // Index buffer
        pBuff = GetBestRestrictions(pBuff, &pPlatformResource->Index);
    }
    if(pTexInfo->Flags.Gpu.FlipChain)
    {
        // Async Flip
        pBuff = GetBestRestrictions(pBuff, &pPlatformResource->ASyncFlipSurface);
    }
    if(pTexInfo->Flags.Gpu.MotionComp)
    {
        // Media buffer
        pBuff = GetBestRestrictions(pBuff, &pPlatformResource->MotionComp);
    }
    if(pTexInfo->Flags.Gpu.State ||
       pTexInfo->Flags.Gpu.InstructionFlat ||
       pTexInfo->Flags.Gpu.ScratchFlat)
    {
        // indirect state
        pBuff = GetBestRestrictions(pBuff, &pPlatformResource->Vertex);
    }
    if(pTexInfo->Flags.Gpu.Query ||
       pTexInfo->Flags.Gpu.HistoryBuffer)
    {
        // Query
        pBuff = GetBestRestrictions(pBuff, &pPlatformResource->NoRestriction);
    }
    if(pTexInfo->Flags.Gpu.Constant)
    {
        //
        pBuff = GetBestRestrictions(pBuff, &pPlatformResource->Constant);
    }
    if(pTexInfo->Flags.Gpu.Stream)
    {
        //
        pBuff = GetBestRestrictions(pBuff, &pPlatformResource->Stream);
    }
    if(pTexInfo->Flags.Gpu.InterlacedScan)
    {
        //
        pBuff = GetBestRestrictions(pBuff, &pPlatformResource->InterlacedScan);
    }
    if(pTexInfo->Flags.Gpu.TextApi)
    {
        //
        pBuff = GetBestRestrictions(pBuff, &pPlatformResource->TextApi);
    }
    if(pTexInfo->Flags.Gpu.SeparateStencil)
    {
        //
        pBuff = GetBestRestrictions(pBuff, &pPlatformResource->Stencil);
    }
    if(pTexInfo->Flags.Gpu.HiZ)
    {
        //
        pBuff = GetBestRestrictions(pBuff, &pPlatformResource->HiZ);
    }
    if(pTexInfo->Flags.Gpu.Video)
    {
        //
        pBuff = GetBestRestrictions(pBuff, &pPlatformResource->Video);
        if(GmmIsReconstructableSurface(pTexInfo->Format))
        {
            pBuff->MaxHeight = pPlatformResource->ReconMaxHeight;
            pBuff->MaxWidth  = pPlatformResource->ReconMaxWidth;
        }
    }
    if(pTexInfo->Flags.Gpu.StateDx9ConstantBuffer)
    {
        //
        pBuff = GetBestRestrictions(pBuff, &pPlatformResource->StateDx9ConstantBuffer);
    }
    if(pTexInfo->Flags.Gpu.Overlay)
    {
        // Overlay buffer use Async Flip values
        pBuff = GetBestRestrictions(pBuff, &pPlatformResource->Overlay);

        if((pTexInfo->Format == GMM_FORMAT_YUY2) && (pTexInfo->BaseWidth == 640))
        {
            // override the pitch alignment
            pBuff->PitchAlignment = 64;
        }
    }
    if(pTexInfo->Flags.Info.XAdapter)
    {
        //Add Cross Adapter resource restriction for hybrid graphics.
        pBuff = GetBestRestrictions(pBuff, &pPlatformResource->XAdapter);
        if(pTexInfo->Type == RESOURCE_BUFFER)
        {
            pBuff->MaxWidth  = pPlatformResource->SurfaceMaxSize;
            pBuff->MaxPitch  = pPlatformResource->BufferType.MaxPitch;
            pBuff->MaxHeight = 1;
        }
    }

    //Non Aligned ExistingSysMem  Special cases.
    if((pTexInfo->Flags.Info.ExistingSysMem &&
        (!pTexInfo->ExistingSysMem.IsGmmAllocated) &&
        (!pTexInfo->ExistingSysMem.IsPageAligned)))
    {

        if(pTexInfo->Flags.Info.Linear ||
           pTexInfo->Flags.Info.SVM)
        {
            if(pTexInfo->Type == RESOURCE_BUFFER)
            {
                //Use combination of BufferType, NoRestriction to support large buffer with minimal pitch alignment
                *pBuff                      = pPlatformResource->BufferType;
                pBuff->PitchAlignment       = pPlatformResource->NoRestriction.PitchAlignment;
                pBuff->LockPitchAlignment   = pPlatformResource->NoRestriction.LockPitchAlignment;
                pBuff->RenderPitchAlignment = pPlatformResource->NoRestriction.LockPitchAlignment;
                pBuff->MinPitch             = pPlatformResource->NoRestriction.MinPitch;
            }

            //[To DO] Handle other types when needed!
        }
        /*
        else if(Surf.Flags.Gpu.Texture)
        {
            //Override as and when required
        }
        else if(Surf.Flags.Gpu.RenderTarget)
        {
            //Overide as and when Required
        }*/
    }

    GMM_DPF_EXIT;
}